

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O0

Maybe<kj::Promise<unsigned_long>_> __thiscall
kj::anon_unknown_123::AsyncPipe::tryPumpFrom
          (AsyncPipe *this,AsyncInputStream *input,uint64_t amount)

{
  Event *in_RCX;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<unsigned_long>_>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<unsigned_long>_>_2 extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<unsigned_long>_>_2 extraout_RDX_01;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<unsigned_long>_>_2 aVar1;
  Maybe<kj::Promise<unsigned_long>_> MVar2;
  undefined1 local_58 [16];
  AsyncCapabilityStream *s;
  AsyncCapabilityStream *_s368;
  Event *local_28;
  uint64_t amount_local;
  AsyncInputStream *input_local;
  AsyncPipe *this_local;
  
  amount_local = amount;
  input_local = input;
  this_local = this;
  if (in_RCX == (Event *)0x0) {
    constPromise<unsigned_long,_0UL>();
    Maybe<kj::Promise<unsigned_long>_>::Maybe
              ((Maybe<kj::Promise<unsigned_long>_> *)this,
               (Promise<unsigned_long> *)&stack0xffffffffffffffd0);
    Promise<unsigned_long>::~Promise((Promise<unsigned_long> *)&stack0xffffffffffffffd0);
    aVar1 = extraout_RDX;
  }
  else {
    local_28 = in_RCX;
    local_58._8_8_ =
         kj::_::readMaybe<kj::AsyncCapabilityStream>
                   ((Maybe<kj::AsyncCapabilityStream_&> *)(input + 4));
    s = (AsyncCapabilityStream *)local_58._8_8_;
    if ((AsyncCapabilityStream *)local_58._8_8_ == (AsyncCapabilityStream *)0x0) {
      newAdaptedPromise<unsigned_long,kj::(anonymous_namespace)::AsyncPipe::BlockedPumpFrom,kj::(anonymous_namespace)::AsyncPipe&,kj::AsyncInputStream&,unsigned_long&>
                ((kj *)local_58,(AsyncPipe *)input,(AsyncInputStream *)amount_local,
                 (unsigned_long *)&stack0xffffffffffffffd8);
      Maybe<kj::Promise<unsigned_long>_>::Maybe
                ((Maybe<kj::Promise<unsigned_long>_> *)this,(Promise<unsigned_long> *)local_58);
      Promise<unsigned_long>::~Promise((Promise<unsigned_long> *)local_58);
      aVar1 = extraout_RDX_01;
    }
    else {
      (*(((AsyncCapabilityStream *)local_58._8_8_)->super_AsyncIoStream).super_AsyncOutputStream.
        _vptr_AsyncOutputStream[2])
                (this,&(((AsyncCapabilityStream *)local_58._8_8_)->super_AsyncIoStream).
                       super_AsyncOutputStream,amount_local,local_28);
      aVar1 = extraout_RDX_00;
    }
  }
  MVar2.ptr.field_1 = aVar1;
  MVar2.ptr._0_8_ = this;
  return (Maybe<kj::Promise<unsigned_long>_>)MVar2.ptr;
}

Assistant:

Maybe<Promise<uint64_t>> tryPumpFrom(
      AsyncInputStream& input, uint64_t amount) override {
    if (amount == 0) {
      return constPromise<uint64_t, 0>();
    } else KJ_IF_SOME(s, state) {
      return s.tryPumpFrom(input, amount);
    } else {
      return newAdaptedPromise<uint64_t, BlockedPumpFrom>(*this, input, amount);
    }
  }